

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QCache<QString,_QRegularExpression>::Node>::freeData
          (Span<QCache<QString,_QRegularExpression>::Node> *this)

{
  byte bVar1;
  Data *pDVar2;
  Node *pNVar3;
  Node *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node *local_18;
  
  if (in_RDI[2].key.d.d != (Data *)0x0) {
    pNVar3 = in_RDI + 2;
    for (local_18 = in_RDI; local_18 != (Node *)&pNVar3->key;
        local_18 = (Node *)((long)&(local_18->super_Chain).prev + 1)) {
      bVar1 = *(byte *)&(local_18->super_Chain).prev;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)((long)in_RDI[2].key.d.d + (ulong)bVar1 * 0x38));
        QCache<QString,_QRegularExpression>::Node::~Node(in_RDI);
      }
    }
    pDVar2 = in_RDI[2].key.d.d;
    if (pDVar2 != (Data *)0x0) {
      operator_delete__(pDVar2);
    }
    in_RDI[2].key.d.d = (Data *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }